

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  ZSTD_dictMode_e dictMode_00;
  ZSTD_matchState_t *ms_00;
  size_t code;
  ZSTD_blockCompressor p_Var13;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff34;
  int local_c0;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor;
  size_t err_code;
  rawSeqStore_t ldmSeqStore;
  size_t sStack_70;
  int i;
  size_t lastLLSize;
  ZSTD_dictMode_e dictMode;
  U32 curr;
  BYTE *istart;
  BYTE *base;
  ZSTD_matchState_t *ms;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx *zc_local;
  
  ms_00 = &(zc->blockState).matchState;
  uVar2 = (zc->appliedParams).cParams.hashLog;
  uVar3 = (zc->appliedParams).cParams.searchLog;
  uVar4 = (zc->appliedParams).cParams.minMatch;
  uVar5 = (zc->appliedParams).cParams.targetLength;
  uVar6 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar6;
  cParams1.searchLog = uVar5;
  cParams1.hashLog = uVar4;
  cParams1.chainLog = uVar3;
  cParams1.windowLog = uVar2;
  uVar1 = (zc->blockState).matchState.cParams.windowLog;
  uVar7 = (zc->blockState).matchState.cParams.hashLog;
  uVar8 = (zc->blockState).matchState.cParams.searchLog;
  uVar9 = (zc->blockState).matchState.cParams.minMatch;
  uVar10 = (zc->blockState).matchState.cParams.targetLength;
  uVar11 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar11;
  cParams2.searchLog = uVar10;
  cParams2.hashLog = uVar9;
  cParams2.chainLog = uVar8;
  cParams2.windowLog = uVar7;
  cParams1.targetLength = in_stack_ffffffffffffff14;
  cParams1.strategy = uVar1;
  cParams2._20_8_ = in_stack_ffffffffffffff34;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    if ((zc->appliedParams).cParams.strategy < ZSTD_btopt) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    zc_local = (ZSTD_CCtx *)0x1;
  }
  else {
    ZSTD_resetSeqStore(&zc->seqStore);
    (zc->blockState).matchState.opt.symbolCosts = &((zc->blockState).prevCBlock)->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    uVar12 = (int)src - (int)(zc->blockState).matchState.window.base;
    if ((zc->blockState).matchState.nextToUpdate + 0x180 < uVar12) {
      if ((uVar12 - (zc->blockState).matchState.nextToUpdate) - 0x180 < 0xc1) {
        local_c0 = (uVar12 - (zc->blockState).matchState.nextToUpdate) + -0x180;
      }
      else {
        local_c0 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar12 - local_c0;
    }
    dictMode_00 = ZSTD_matchState_dictMode(ms_00);
    for (ldmSeqStore.capacity._4_4_ = 0; ldmSeqStore.capacity._4_4_ < 3;
        ldmSeqStore.capacity._4_4_ = ldmSeqStore.capacity._4_4_ + 1) {
      ((zc->blockState).nextCBlock)->rep[ldmSeqStore.capacity._4_4_] =
           ((zc->blockState).prevCBlock)->rep[ldmSeqStore.capacity._4_4_];
    }
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      sStack_70 = ZSTD_ldm_blockCompress
                            (&zc->externSeqStore,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,
                             (zc->appliedParams).useRowMatchFinder,src,srcSize);
    }
    else if ((zc->appliedParams).ldmParams.enableLdm == 0) {
      p_Var13 = ZSTD_selectBlockCompressor
                          ((zc->appliedParams).cParams.strategy,
                           (zc->appliedParams).useRowMatchFinder,dictMode_00);
      (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      sStack_70 = (*p_Var13)(ms_00,&zc->seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      memset(&err_code,0,0x28);
      err_code = (size_t)zc->ldmSequences;
      ldmSeqStore.size = zc->maxNbLdmSequences;
      code = ZSTD_ldm_generateSequences
                       (&zc->ldmState,(rawSeqStore_t *)&err_code,&(zc->appliedParams).ldmParams,src,
                        srcSize);
      uVar12 = ERR_isError(code);
      if (uVar12 != 0) {
        return code;
      }
      sStack_70 = ZSTD_ldm_blockCompress
                            ((rawSeqStore_t *)&err_code,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,
                             (zc->appliedParams).useRowMatchFinder,src,srcSize);
    }
    ZSTD_storeLastLiterals(&zc->seqStore,(BYTE *)((long)src + (srcSize - sStack_70)),sStack_70);
    zc_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}